

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint generateFixedDistanceTree(HuffmanTree *tree)

{
  uint *bitlen_00;
  uint *bitlen;
  uint error;
  uint i;
  size_t in_stack_ffffffffffffffd8;
  undefined4 uVar1;
  uint uVar2;
  uint local_4;
  
  uVar1 = 0;
  bitlen_00 = (uint *)lodepng_malloc(0x16e9bb);
  if (bitlen_00 == (uint *)0x0) {
    local_4 = 0x53;
  }
  else {
    for (uVar2 = 0; uVar2 != 0x20; uVar2 = uVar2 + 1) {
      bitlen_00[uVar2] = 5;
    }
    local_4 = HuffmanTree_makeFromLengths
                        ((HuffmanTree *)CONCAT44(0x20,uVar1),bitlen_00,in_stack_ffffffffffffffd8,0);
    lodepng_free((void *)0x16ea25);
  }
  return local_4;
}

Assistant:

static unsigned generateFixedDistanceTree(HuffmanTree* tree) {
  unsigned i, error = 0;
  unsigned* bitlen = (unsigned*)lodepng_malloc(NUM_DISTANCE_SYMBOLS * sizeof(unsigned));
  if (!bitlen) return 83; /*alloc fail*/

  /*there are 32 distance codes, but 30-31 are unused*/
  for (i = 0; i != NUM_DISTANCE_SYMBOLS; ++i) bitlen[i] = 5;
  error = HuffmanTree_makeFromLengths(tree, bitlen, NUM_DISTANCE_SYMBOLS, 15);

  lodepng_free(bitlen);
  return error;
}